

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Mapping.c
# Opt level: O0

void op_addReg(MCInst *MI,int reg)

{
  cs_detail *pcVar1;
  uint8_t *puVar2;
  int reg_local;
  MCInst *MI_local;
  
  if (MI->csh->detail != CS_OPT_OFF) {
    puVar2 = MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x3e;
    puVar2[0] = '\x01';
    puVar2[1] = '\0';
    puVar2[2] = '\0';
    puVar2[3] = '\0';
    *(int *)(MI->flat_insn->detail->groups +
            (ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x46) = reg;
    MI->flat_insn->detail->groups
    [(ulong)(MI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x5e] = MI->csh->regsize_map[reg]
    ;
    pcVar1 = MI->flat_insn->detail;
    (pcVar1->field_6).x86.op_count = (pcVar1->field_6).x86.op_count + '\x01';
  }
  if (MI->op1_size == '\0') {
    MI->op1_size = MI->csh->regsize_map[reg];
  }
  return;
}

Assistant:

void op_addReg(MCInst *MI, int reg)
{
	if (MI->csh->detail) {
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].type = X86_OP_REG;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].reg = reg;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = MI->csh->regsize_map[reg];
		MI->flat_insn->detail->x86.op_count++;
	}

	if (MI->op1_size == 0)
		MI->op1_size = MI->csh->regsize_map[reg];
}